

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O2

bool __thiscall
lzham::raw_quasi_adaptive_huffman_data_model::reset(raw_quasi_adaptive_huffman_data_model *this)

{
  uint uVar1;
  unsigned_short *puVar2;
  bool bVar3;
  uint i;
  ulong uVar4;
  bool bVar5;
  
  uVar1 = this->m_total_syms;
  bVar5 = true;
  if ((ulong)uVar1 != 0) {
    puVar2 = (this->m_sym_freq).m_p;
    for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      puVar2[uVar4] = 1;
    }
    this->m_total_count = 0;
    this->m_update_cycle = uVar1;
    bVar3 = update(this);
    if (bVar3) {
      this->m_update_cycle = 8;
      this->m_symbols_until_update = 8;
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool raw_quasi_adaptive_huffman_data_model::reset()
   {
      if (!m_total_syms)
         return true;

      for (uint i = 0; i < m_total_syms; i++)
         m_sym_freq[i] = 1;

      m_total_count = 0;
      m_update_cycle = m_total_syms;

      if (!update())
         return false;

      m_symbols_until_update = m_update_cycle = 8;
      return true;
   }